

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::handleWrite(TcpConnection *this)

{
  uint64_t *puVar1;
  EventLoop *this_00;
  bool bVar2;
  int iVar3;
  self *this_01;
  LogStream *this_02;
  size_t sVar4;
  SourceFile file;
  SourceFile file_00;
  Logger local_1060;
  Functor local_90;
  undefined1 local_70 [12];
  undefined1 local_60 [12];
  __shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  Buffer *local_40;
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *local_38;
  
  EventLoop::assertInLoopThread(this->m_loop);
  if ((((this->m_channel)._M_t.
        super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>._M_t.
        super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
        super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->m_events & 8) == 0) {
    if (g_logLevel < 1) {
      Logger::SourceFile::SourceFile<104>
                ((SourceFile *)local_60,
                 (char (*) [104])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_60._0_8_;
      file.m_size = local_60._8_4_;
      Logger::Logger(&local_1060,file,399,TRACE,"handleWrite");
      this_01 = LogStream::operator<<(&local_1060.m_impl.m_stream,"Connection fd = ");
      this_02 = LogStream::operator<<
                          (this_01,((this->m_channel)._M_t.
                                    super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                                    .super__Head_base<0UL,_sznet::net::Channel_*,_false>.
                                   _M_head_impl)->m_fd);
      LogStream::operator<<(this_02," is down, no more writing");
      Logger::~Logger(&local_1060);
    }
  }
  else {
    local_40 = &this->m_outputBuffer;
    local_38 = &this->m_writeCompleteCallback;
    while ((this->m_outputBuffer).m_writerIndex != (this->m_outputBuffer).m_readerIndex) {
      while (sVar4 = (this->m_outputBuffer).m_readerIndex,
            sVar4 = sockets::sz_socket_write
                              (((this->m_channel)._M_t.
                                super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                                .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->
                               m_fd,(this->m_outputBuffer).m_buffer.
                                    super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_start + sVar4,
                               (this->m_outputBuffer).m_writerIndex - sVar4),
            sVar4 == 0xffffffffffffffff) {
        iVar3 = sz_getlasterr();
        if (iVar3 != 4) goto LAB_0012a48e;
      }
      if ((long)sVar4 < 1) {
LAB_0012a48e:
        bVar2 = sockets::sz_wouldblock();
        if (bVar2) {
          return;
        }
        Logger::SourceFile::SourceFile<104>
                  ((SourceFile *)local_70,
                   (char (*) [104])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                  );
        file_00._12_4_ = 0;
        file_00.m_data = (char *)local_70._0_8_;
        file_00.m_size = local_70._8_4_;
        Logger::Logger(&local_1060,file_00,0x185,false);
        LogStream::operator<<(&local_1060.m_impl.m_stream,"TcpConnection::handleWrite");
        Logger::~Logger(&local_1060);
        handleError(this);
        handleClose(this);
        return;
      }
      puVar1 = &(this->m_netStatInfo).m_sendBytes;
      *puVar1 = *puVar1 + sVar4;
      Buffer::retrieve(local_40,sVar4);
      if ((this->m_outputBuffer).m_writerIndex == (this->m_outputBuffer).m_readerIndex) {
        Channel::disableWriting
                  ((this->m_channel)._M_t.
                   super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                   .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl);
        if ((this->m_writeCompleteCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
          this_00 = this->m_loop;
          std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<sznet::net::TcpConnection,void>
                    (local_50,(__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                              this);
          std::
          _Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>(std::shared_ptr<sznet::net::TcpConnection>)>
          ::_Bind<std::shared_ptr<sznet::net::TcpConnection>>
                    ((_Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>(std::shared_ptr<sznet::net::TcpConnection>)>
                      *)&local_1060,local_38,(shared_ptr<sznet::net::TcpConnection> *)local_50);
          std::function<void()>::
          function<std::_Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>(std::shared_ptr<sznet::net::TcpConnection>)>,void>
                    ((function<void()> *)&local_90,
                     (_Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
                      *)&local_1060);
          EventLoop::queueInLoop(this_00,&local_90);
          std::_Function_base::~_Function_base(&local_90.super__Function_base);
          std::
          _Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
          ::~_Bind((_Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
                    *)&local_1060);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
        }
        if (this->m_state == kDisconnecting) {
          shutdownInLoop(this);
        }
      }
    }
  }
  return;
}

Assistant:

void TcpConnection::handleWrite()
{
	m_loop->assertInLoopThread();
	if (m_channel->isWriting())
	{
		sz_ssize_t n = 0;
		while(m_outputBuffer.readableBytes() > 0)
		{
			do
			{
				n = sockets::sz_socket_write(m_channel->fd(), m_outputBuffer.peek(), m_outputBuffer.readableBytes());
			} while (n == -1 && sz_getlasterr() == sz_err_eintr);
			if (n > 0)
			{
				m_netStatInfo.m_sendBytes += n;
				m_outputBuffer.retrieve(n);
				if (m_outputBuffer.readableBytes() == 0)
				{
					m_channel->disableWriting();
					if (m_writeCompleteCallback)
					{
						m_loop->queueInLoop(std::bind(m_writeCompleteCallback, shared_from_this()));
					}
					if (m_state == kDisconnecting)
					{
						shutdownInLoop();
					}
				}
			}
			else
			{
				if (!sockets::sz_wouldblock())
				{
					LOG_SYSERR << "TcpConnection::handleWrite";
					handleError();
					handleClose();
				}
				return;
			}
		}
	}
	else
	{
		LOG_TRACE << "Connection fd = " << m_channel->fd()
			<< " is down, no more writing";
	}
}